

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffer.cpp
# Opt level: O0

void __thiscall char_buffer_udls_Test::~char_buffer_udls_Test(char_buffer_udls_Test *this)

{
  char_buffer_udls_Test *this_local;
  
  ~char_buffer_udls_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(char_buffer, udls)
{
    using namespace ST::literals;

    // Only need to test the UDL usage -- the rest is covered above
    EXPECT_EQ(ST_CHAR_LITERAL(""), ""_stbuf);
    EXPECT_EQ(ST_CHAR_LITERAL("Test"), "Test"_stbuf);
    EXPECT_EQ(ST_WCHAR_LITERAL("Test"), L"Test"_stbuf);
    EXPECT_EQ(ST_UTF16_LITERAL("Test"), u"Test"_stbuf);
    EXPECT_EQ(ST_UTF32_LITERAL("Test"), U"Test"_stbuf);
#ifdef ST_HAVE_CXX20_CHAR8_TYPES
    EXPECT_EQ(ST_CHAR_LITERAL("Test"), u8"Test"_stbuf);
#endif
}